

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256.c
# Opt level: O0

void exp_vartime_precomp(uint64_t *n,uint64_t mu,uint64_t *r2,uint64_t *a,uint32_t bBits,uint64_t *b
                        ,uint64_t *res)

{
  uint64_t uVar1;
  uint64_t *ctx_n_9;
  uint64_t *a_bits_l_1;
  uint32_t bits_l32_1;
  uint64_t bits_l;
  uint32_t k;
  uint64_t *ctx_n_13;
  uint64_t *ctx_n_12;
  uint64_t *ctx_n_11;
  uint64_t *ctx_n_10;
  uint32_t i0;
  uint32_t i_3;
  uint64_t tmp0 [64];
  uint64_t *ctx_r2_1;
  uint64_t *ctx_n_8;
  uint64_t *a_bits_l;
  uint32_t bits_l32;
  uint64_t bits_c;
  uint32_t i_2;
  uint64_t *ctx_n_7;
  uint64_t *t2_6;
  uint64_t *ctx_n1_6;
  uint64_t *t11_6;
  uint64_t *ctx_n_6;
  uint64_t *t2_5;
  uint64_t *ctx_n1_5;
  uint64_t *t11_5;
  uint64_t *ctx_n_5;
  uint64_t *t2_4;
  uint64_t *ctx_n1_4;
  uint64_t *t11_4;
  uint64_t *ctx_n_4;
  uint64_t *t2_3;
  uint64_t *ctx_n1_3;
  uint64_t *t11_3;
  uint64_t *ctx_n_3;
  uint64_t *t2_2;
  uint64_t *ctx_n1_2;
  uint64_t *t11_2;
  uint64_t *ctx_n_2;
  uint64_t *t2_1;
  uint64_t *ctx_n1_1;
  uint64_t *t11_1;
  uint64_t *ctx_n_1;
  uint64_t *t2;
  uint64_t *ctx_n1;
  uint64_t *t11;
  uint32_t i_1;
  uint64_t *ctx_r20;
  uint64_t *ctx_n0;
  uint64_t *t1;
  uint64_t *t0;
  uint64_t tmp [64];
  uint64_t table [1024];
  uint64_t ctx [128];
  uint32_t local_c7c;
  uint32_t bLen;
  uint64_t resM [64];
  uint64_t aM [64];
  uint64_t *ctx_n0_1;
  uint64_t *ctx_n0_2;
  uint64_t bit;
  uint64_t tmp_1;
  uint32_t j;
  uint32_t i1;
  uint32_t i;
  uint64_t *ctx_r2;
  uint64_t *ctx_n;
  uint64_t ctx_1 [128];
  uint64_t resM_1 [64];
  uint64_t aM_1 [64];
  uint64_t *b_local;
  uint32_t bBits_local;
  uint64_t *a_local;
  uint64_t *r2_local;
  uint64_t mu_local;
  uint64_t *n_local;
  
  if (bBits < 200) {
    memset(resM_1 + 0x3f,0,0x200);
    to(n,mu,r2,a,resM_1 + 0x3f);
    memset(ctx_1 + 0x7f,0,0x200);
    memset(&ctx_n,0,0x400);
    memcpy(&ctx_n,n,0x200);
    memcpy(ctx_1 + 0x3f,r2,0x200);
    from((uint64_t *)&ctx_n,mu,ctx_1 + 0x3f,ctx_1 + 0x7f);
    for (j = 0; j < bBits; j = j + 1) {
      if ((b[j >> 6] >> ((byte)j & 0x3f) & 1) != 0) {
        amont_mul((uint64_t *)&ctx_n,mu,ctx_1 + 0x7f,resM_1 + 0x3f,ctx_1 + 0x7f);
      }
      amont_sqr((uint64_t *)&ctx_n,mu,resM_1 + 0x3f,resM_1 + 0x3f);
    }
    from(n,mu,ctx_1 + 0x7f,res);
  }
  else {
    memset(resM + 0x3f,0,0x200);
    to(n,mu,r2,a,resM + 0x3f);
    memset(&stack0xfffffffffffff388,0,0x200);
    if (bBits == 0) {
      local_c7c = 1;
    }
    else {
      local_c7c = (bBits - 1 >> 6) + 1;
    }
    memset(table + 0x3ff,0,0x400);
    memcpy(table + 0x3ff,n,0x200);
    memcpy(ctx + 0x3f,r2,0x200);
    memset(tmp + 0x3f,0,0x2000);
    memset(&t0,0,0x200);
    from(table + 0x3ff,mu,ctx + 0x3f,tmp + 0x3f);
    memcpy(table + 0x3f,resM + 0x3f,0x200);
    amont_sqr(table + 0x3ff,mu,table + 0x3f,(uint64_t *)&t0);
    memcpy(table + 0x7f,&t0,0x200);
    amont_mul(table + 0x3ff,mu,resM + 0x3f,table + 0x7f,(uint64_t *)&t0);
    memcpy(table + 0xbf,&t0,0x200);
    amont_sqr(table + 0x3ff,mu,table + 0x7f,(uint64_t *)&t0);
    memcpy(table + 0xff,&t0,0x200);
    amont_mul(table + 0x3ff,mu,resM + 0x3f,table + 0xff,(uint64_t *)&t0);
    memcpy(table + 0x13f,&t0,0x200);
    amont_sqr(table + 0x3ff,mu,table + 0xbf,(uint64_t *)&t0);
    memcpy(table + 0x17f,&t0,0x200);
    amont_mul(table + 0x3ff,mu,resM + 0x3f,table + 0x17f,(uint64_t *)&t0);
    memcpy(table + 0x1bf,&t0,0x200);
    amont_sqr(table + 0x3ff,mu,table + 0xff,(uint64_t *)&t0);
    memcpy(table + 0x1ff,&t0,0x200);
    amont_mul(table + 0x3ff,mu,resM + 0x3f,table + 0x1ff,(uint64_t *)&t0);
    memcpy(table + 0x23f,&t0,0x200);
    amont_sqr(table + 0x3ff,mu,table + 0x13f,(uint64_t *)&t0);
    memcpy(table + 0x27f,&t0,0x200);
    amont_mul(table + 0x3ff,mu,resM + 0x3f,table + 0x27f,(uint64_t *)&t0);
    memcpy(table + 0x2bf,&t0,0x200);
    amont_sqr(table + 0x3ff,mu,table + 0x17f,(uint64_t *)&t0);
    memcpy(table + 0x2ff,&t0,0x200);
    amont_mul(table + 0x3ff,mu,resM + 0x3f,table + 0x2ff,(uint64_t *)&t0);
    memcpy(table + 0x33f,&t0,0x200);
    amont_sqr(table + 0x3ff,mu,table + 0x1bf,(uint64_t *)&t0);
    memcpy(table + 0x37f,&t0,0x200);
    amont_mul(table + 0x3ff,mu,resM + 0x3f,table + 0x37f,(uint64_t *)&t0);
    memcpy(table + 0x3bf,&t0,0x200);
    if ((bBits & 3) == 0) {
      from(table + 0x3ff,mu,ctx + 0x3f,(uint64_t *)&stack0xfffffffffffff388);
    }
    else {
      uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(local_c7c,b,bBits & 0xfffffffc,4);
      memcpy(&stack0xfffffffffffff388,tmp + (ulong)(uint)((int)uVar1 << 6) + 0x3f,0x200);
    }
    memset(&i0,0,0x200);
    for (ctx_n_10._4_4_ = 0; ctx_n_10._4_4_ < bBits >> 2; ctx_n_10._4_4_ = ctx_n_10._4_4_ + 1) {
      amont_sqr(table + 0x3ff,mu,(uint64_t *)&stack0xfffffffffffff388,
                (uint64_t *)&stack0xfffffffffffff388);
      amont_sqr(table + 0x3ff,mu,(uint64_t *)&stack0xfffffffffffff388,
                (uint64_t *)&stack0xfffffffffffff388);
      amont_sqr(table + 0x3ff,mu,(uint64_t *)&stack0xfffffffffffff388,
                (uint64_t *)&stack0xfffffffffffff388);
      amont_sqr(table + 0x3ff,mu,(uint64_t *)&stack0xfffffffffffff388,
                (uint64_t *)&stack0xfffffffffffff388);
      uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64
                        (local_c7c,b,((bBits - (bBits & 3)) + ctx_n_10._4_4_ * -4) - 4,4);
      memcpy(&i0,tmp + (ulong)(uint)((int)uVar1 << 6) + 0x3f,0x200);
      amont_mul(table + 0x3ff,mu,(uint64_t *)&stack0xfffffffffffff388,(uint64_t *)&i0,
                (uint64_t *)&stack0xfffffffffffff388);
    }
    from(n,mu,(uint64_t *)&stack0xfffffffffffff388,res);
  }
  return;
}

Assistant:

static inline void
exp_vartime_precomp(
  uint64_t *n,
  uint64_t mu,
  uint64_t *r2,
  uint64_t *a,
  uint32_t bBits,
  uint64_t *b,
  uint64_t *res
)
{
  if (bBits < 200U)
  {
    uint64_t aM[4U] = { 0U };
    to(n, mu, r2, a, aM);
    uint64_t resM[4U] = { 0U };
    uint64_t ctx[8U] = { 0U };
    memcpy(ctx, n, 4U * sizeof (uint64_t));
    memcpy(ctx + 4U, r2, 4U * sizeof (uint64_t));
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + 4U;
    from(ctx_n, mu, ctx_r2, resM);
    for (uint32_t i = 0U; i < bBits; i++)
    {
      uint32_t i1 = i / 64U;
      uint32_t j = i % 64U;
      uint64_t tmp = b[i1];
      uint64_t bit = tmp >> j & 1ULL;
      if (!(bit == 0ULL))
      {
        uint64_t *ctx_n0 = ctx;
        amont_mul(ctx_n0, mu, resM, aM, resM);
      }
      uint64_t *ctx_n0 = ctx;
      amont_sqr(ctx_n0, mu, aM, aM);
    }
    from(n, mu, resM, res);
    return;
  }
  uint64_t aM[4U] = { 0U };
  to(n, mu, r2, a, aM);
  uint64_t resM[4U] = { 0U };
  uint32_t bLen;
  if (bBits == 0U)
  {
    bLen = 1U;
  }
  else
  {
    bLen = (bBits - 1U) / 64U + 1U;
  }
  uint64_t ctx[8U] = { 0U };
  memcpy(ctx, n, 4U * sizeof (uint64_t));
  memcpy(ctx + 4U, r2, 4U * sizeof (uint64_t));
  uint64_t table[64U] = { 0U };
  uint64_t tmp[4U] = { 0U };
  uint64_t *t0 = table;
  uint64_t *t1 = table + 4U;
  uint64_t *ctx_n0 = ctx;
  uint64_t *ctx_r20 = ctx + 4U;
  from(ctx_n0, mu, ctx_r20, t0);
  memcpy(t1, aM, 4U * sizeof (uint64_t));
  KRML_MAYBE_FOR7(i,
    0U,
    7U,
    1U,
    uint64_t *t11 = table + (i + 1U) * 4U;
    uint64_t *ctx_n1 = ctx;
    amont_sqr(ctx_n1, mu, t11, tmp);
    memcpy(table + (2U * i + 2U) * 4U, tmp, 4U * sizeof (uint64_t));
    uint64_t *t2 = table + (2U * i + 2U) * 4U;
    uint64_t *ctx_n = ctx;
    amont_mul(ctx_n, mu, aM, t2, tmp);
    memcpy(table + (2U * i + 3U) * 4U, tmp, 4U * sizeof (uint64_t)););
  if (bBits % 4U != 0U)
  {
    uint32_t i = bBits / 4U * 4U;
    uint64_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, i, 4U);
    uint32_t bits_l32 = (uint32_t)bits_c;
    const uint64_t *a_bits_l = table + bits_l32 * 4U;
    memcpy(resM, (uint64_t *)a_bits_l, 4U * sizeof (uint64_t));
  }
  else
  {
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + 4U;
    from(ctx_n, mu, ctx_r2, resM);
  }
  uint64_t tmp0[4U] = { 0U };
  for (uint32_t i = 0U; i < bBits / 4U; i++)
  {
    KRML_MAYBE_FOR4(i0,
      0U,
      4U,
      1U,
      uint64_t *ctx_n = ctx;
      amont_sqr(ctx_n, mu, resM, resM););
    uint32_t k = bBits - bBits % 4U - 4U * i - 4U;
    uint64_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, k, 4U);
    uint32_t bits_l32 = (uint32_t)bits_l;
    const uint64_t *a_bits_l = table + bits_l32 * 4U;
    memcpy(tmp0, (uint64_t *)a_bits_l, 4U * sizeof (uint64_t));
    uint64_t *ctx_n = ctx;
    amont_mul(ctx_n, mu, resM, tmp0, resM);
  }
  from(n, mu, resM, res);
}